

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O0

void __thiscall
node::MiniMiner::DeleteAncestorPackage
          (MiniMiner *this,
          set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          *ancestors)

{
  long lVar1;
  bool bVar2;
  CAmount CVar3;
  int64_t iVar4;
  pointer ppVar5;
  long in_RDI;
  long in_FS_OFFSET;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *anc_1;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  *__range1_1;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *descendant;
  vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  *__range2;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *anc;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  *__range1;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
  vec_it;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end2;
  iterator __begin2;
  iterator it;
  iterator __end1;
  iterator __begin1;
  MiniMinerMempoolEntry *in_stack_fffffffffffffea8;
  map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
  *in_stack_fffffffffffffeb0;
  MiniMinerMempoolEntry *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
  in_stack_fffffffffffffed0;
  const_iterator in_stack_fffffffffffffed8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ::size((set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          *)in_stack_fffffffffffffea8);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
             (char *)in_stack_fffffffffffffea8);
  std::
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ::begin((set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
           *)in_stack_fffffffffffffeb0);
  std::
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ::end((set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
         *)in_stack_fffffffffffffeb0);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffeb8,(_Self *)in_stack_fffffffffffffeb0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
    ::operator*((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
                 *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed8._M_current =
         (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)(in_RDI + 200)
    ;
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
               in_stack_fffffffffffffeb8,(key_type *)in_stack_fffffffffffffeb0);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::insert
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
               in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    CVar3 = MiniMinerMempoolEntry::GetModifiedFee(in_stack_fffffffffffffea8);
    *(CAmount *)(in_RDI + 0xf8) = CVar3 + *(long *)(in_RDI + 0xf8);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    iVar4 = MiniMinerMempoolEntry::GetTxSize(in_stack_fffffffffffffea8);
    *(int *)(in_RDI + 0x100) = *(int *)(in_RDI + 0x100) + (int)iVar4;
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    std::
    map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
    ::find((map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
            *)in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
    std::
    map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
    ::end((map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
           *)in_stack_fffffffffffffeb0);
    std::operator==((_Self *)in_stack_fffffffffffffeb8,(_Self *)in_stack_fffffffffffffeb0);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>
                  *)in_stack_fffffffffffffea8);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::begin((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
             *)in_stack_fffffffffffffeb0);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::end((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
           *)in_stack_fffffffffffffeb0);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                        ((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                          *)in_stack_fffffffffffffeb8,
                         (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                          *)in_stack_fffffffffffffeb0);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
      ::operator*((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                   *)in_stack_fffffffffffffea8);
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      in_stack_fffffffffffffeb8 =
           (MiniMinerMempoolEntry *)
           MiniMinerMempoolEntry::GetModFeesWithAncestors(in_stack_fffffffffffffea8);
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      MiniMinerMempoolEntry::GetModifiedFee(in_stack_fffffffffffffea8);
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8);
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      in_stack_fffffffffffffec0 =
           (char *)MiniMinerMempoolEntry::GetSizeWithAncestors(in_stack_fffffffffffffea8);
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      MiniMinerMempoolEntry::GetTxSize(in_stack_fffffffffffffea8);
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::
               operator->((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>
                           *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffec8._M_node = (_Base_ptr)&ppVar5->second;
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      iVar4 = MiniMinerMempoolEntry::GetTxSize(in_stack_fffffffffffffea8);
      in_stack_fffffffffffffed0._M_current =
           (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)-iVar4;
      std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                 in_stack_fffffffffffffea8);
      MiniMinerMempoolEntry::GetModifiedFee(in_stack_fffffffffffffea8);
      MiniMinerMempoolEntry::UpdateAncestorState
                (in_stack_fffffffffffffeb8,(int64_t)in_stack_fffffffffffffeb0,
                 (CAmount)in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
      ::operator++((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                    *)in_stack_fffffffffffffea8);
    }
    std::
    _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
    ::operator++((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
                  *)in_stack_fffffffffffffea8);
  }
  std::
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ::begin((set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
           *)in_stack_fffffffffffffeb0);
  std::
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ::end((set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
         *)in_stack_fffffffffffffeb0);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffeb8,(_Self *)in_stack_fffffffffffffeb0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
    ::operator*((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
                 *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffea8 = (MiniMinerMempoolEntry *)(in_RDI + 0x150);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    std::
    map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
    ::erase((map<uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
             *)in_stack_fffffffffffffeb8,(key_type *)in_stack_fffffffffffffeb0);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    MiniMinerMempoolEntry::GetModFeesWithAncestors(in_stack_fffffffffffffea8);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffea8);
    MiniMinerMempoolEntry::GetSizeWithAncestors(in_stack_fffffffffffffea8);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::begin((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
             *)in_stack_fffffffffffffeb0);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::end((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
           *)in_stack_fffffffffffffeb0);
    std::
    find<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>*,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
              ((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                )in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0,
               (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
               in_stack_fffffffffffffeb0);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::end((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
           *)in_stack_fffffffffffffeb0);
    __gnu_cxx::
    operator==<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
              ((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                *)in_stack_fffffffffffffeb8,
               (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                *)in_stack_fffffffffffffeb0);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffec8._M_node,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 =
         (map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
          *)(in_RDI + 0x138);
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const*,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>
    ::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>*>
              ((__normal_iterator<const_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                *)in_stack_fffffffffffffeb8,
               (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
                *)in_stack_fffffffffffffeb0);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::erase((vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
             *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffed8);
    std::
    map<uint256,node::MiniMinerMempoolEntry,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
    ::erase_abi_cxx11_(in_stack_fffffffffffffeb0,in_stack_fffffffffffffec8);
    std::
    _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
    ::operator++((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
                  *)in_stack_fffffffffffffea8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MiniMiner::DeleteAncestorPackage(const std::set<MockEntryMap::iterator, IteratorComparator>& ancestors)
{
    Assume(ancestors.size() >= 1);
    // "Mine" all transactions in this ancestor set.
    for (auto& anc : ancestors) {
        Assume(m_in_block.count(anc->first) == 0);
        m_in_block.insert(anc->first);
        m_total_fees += anc->second.GetModifiedFee();
        m_total_vsize += anc->second.GetTxSize();
        auto it = m_descendant_set_by_txid.find(anc->first);
        // Each entry’s descendant set includes itself
        Assume(it != m_descendant_set_by_txid.end());
        for (auto& descendant : it->second) {
            // If these fail, we must be double-deducting.
            Assume(descendant->second.GetModFeesWithAncestors() >= anc->second.GetModifiedFee());
            Assume(descendant->second.GetSizeWithAncestors() >= anc->second.GetTxSize());
            descendant->second.UpdateAncestorState(-anc->second.GetTxSize(), -anc->second.GetModifiedFee());
        }
    }
    // Delete these entries.
    for (const auto& anc : ancestors) {
        m_descendant_set_by_txid.erase(anc->first);
        // The above loop should have deducted each ancestor's size and fees from each of their
        // respective descendants exactly once.
        Assume(anc->second.GetModFeesWithAncestors() == 0);
        Assume(anc->second.GetSizeWithAncestors() == 0);
        auto vec_it = std::find(m_entries.begin(), m_entries.end(), anc);
        Assume(vec_it != m_entries.end());
        m_entries.erase(vec_it);
        m_entries_by_txid.erase(anc);
    }
}